

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O1

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>,_3,_0>
       ::run(CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
             *mat,scalar_sum_op<double> *func)

{
  ulong uVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Index index;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  uVar1 = (mat->m_xpr).
          super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
          .m_rows.m_value;
  if (uVar1 == 0) {
    __assert_fail("size && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Redux.h"
                  ,0xca,
                  "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>, 4, 1, true>, -1, 1>, -1, 1>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>, 4, 1, true>, -1, 1>, -1, 1>>, Traversal = 3, Unrolling = 0]"
                 );
  }
  uVar7 = uVar1 + 3;
  if (-1 < (long)uVar1) {
    uVar7 = uVar1;
  }
  pdVar2 = (mat->m_xpr).
           super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
           .m_data;
  if (uVar1 + 1 < 3) {
    dVar10 = *pdVar2 * *pdVar2;
    if (1 < (long)uVar1) {
      uVar7 = 1;
      do {
        dVar10 = dVar10 + pdVar2[uVar7] * pdVar2[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
  }
  else {
    uVar8 = uVar1 - ((long)uVar1 >> 0x3f) & 0xfffffffffffffffe;
    dVar13 = *pdVar2 * *pdVar2;
    dVar10 = pdVar2[1] * pdVar2[1];
    if (3 < (long)uVar1) {
      uVar7 = uVar7 & 0xfffffffffffffffc;
      dVar11 = pdVar2[2] * pdVar2[2];
      dVar12 = pdVar2[3] * pdVar2[3];
      if (7 < (long)uVar1) {
        lVar9 = 4;
        do {
          dVar3 = pdVar2[lVar9];
          dVar4 = (pdVar2 + lVar9)[1];
          dVar5 = pdVar2[lVar9 + 2];
          dVar6 = (pdVar2 + lVar9 + 2)[1];
          dVar13 = dVar13 + dVar3 * dVar3;
          dVar10 = dVar10 + dVar4 * dVar4;
          dVar11 = dVar11 + dVar5 * dVar5;
          dVar12 = dVar12 + dVar6 * dVar6;
          lVar9 = lVar9 + 4;
        } while (lVar9 < (long)uVar7);
      }
      dVar13 = dVar11 + dVar13;
      dVar10 = dVar12 + dVar10;
      if ((long)uVar7 < (long)uVar8) {
        dVar11 = pdVar2[uVar7];
        dVar12 = (pdVar2 + uVar7)[1];
        dVar13 = dVar13 + dVar11 * dVar11;
        dVar10 = dVar10 + dVar12 * dVar12;
      }
    }
    dVar10 = dVar10 + dVar13;
    if ((long)uVar8 < (long)uVar1) {
      do {
        dVar10 = dVar10 + pdVar2[uVar8] * pdVar2[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
  }
  return dVar10;
}

Assistant:

static Scalar run(const Derived& mat, const Func& func)
  {
    const Index size = mat.size();
    eigen_assert(size && "you are using an empty matrix");
    const Index packetSize = packet_traits<Scalar>::size;
    const Index alignedStart = internal::first_aligned(mat);
    enum {
      alignment = bool(Derived::Flags & DirectAccessBit) || bool(Derived::Flags & AlignedBit)
                ? Aligned : Unaligned
    };
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }